

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

CK_RV __thiscall
SoftHSM::AsymVerifyInit
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_MECHANISM_PTR pMechanism,
          CK_OBJECT_HANDLE hKey)

{
  CK_MECHANISM_TYPE CVar1;
  long lVar2;
  long *plVar3;
  Type inMechanism;
  bool bVar4;
  int iVar5;
  int iVar6;
  Session *this_00;
  Token *pTVar7;
  OSObject *key;
  CK_STATE sessionState;
  CK_RV CVar8;
  CryptoFactory *pCVar9;
  SoftHSM *inAsymmetricCryptoOp;
  DSAPublicKey *publicKey;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  SoftHSM *pSVar10;
  undefined4 uVar11;
  CK_RV CStack_70;
  long local_60;
  size_t local_58;
  undefined8 *local_50;
  undefined8 local_48;
  long local_40;
  Token *local_38;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  if (this->isInitialised != true) {
    return 400;
  }
  if (pMechanism == (CK_MECHANISM_PTR)0x0) {
    return 7;
  }
  this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_00 == (Session *)0x0) {
    return 0xb3;
  }
  iVar5 = Session::getOpType(this_00);
  if (iVar5 != 0) {
    return 0x90;
  }
  pTVar7 = Session::getToken(this_00);
  if (pTVar7 == (Token *)0x0) goto LAB_00137257;
  key = (OSObject *)HandleManager::getObject(this->handleManager,hKey);
  if (key == (OSObject *)0x0) {
    return 0x82;
  }
  iVar5 = (*key->_vptr_OSObject[10])(key);
  if ((char)iVar5 == '\0') {
    return 0x82;
  }
  local_38 = pTVar7;
  iVar5 = (*key->_vptr_OSObject[4])(key,1,0);
  iVar6 = (*key->_vptr_OSObject[4])(key,2,1);
  sessionState = Session::getState(this_00);
  CVar8 = haveRead(sessionState,(CK_BBOOL)iVar5,(CK_BBOOL)iVar6);
  if (CVar8 != 0) {
    if (CVar8 == 0x101) {
      softHSMLog(6,"AsymVerifyInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0x13e3,"User is not authorized");
      return 0x101;
    }
    return CVar8;
  }
  uVar11 = 1;
  local_60 = 1;
  iVar5 = (*key->_vptr_OSObject[4])(key,0x10a,0);
  if ((char)iVar5 == '\0') {
    return 0x68;
  }
  bVar4 = isMechanismPermitted(this,key,pMechanism);
  if (!bVar4) {
    return 0x70;
  }
  CVar1 = pMechanism->mechanism;
  CStack_70 = 0x70;
  bVar4 = false;
  switch(CVar1) {
  case 1:
    inMechanism = RSA_PKCS;
    goto LAB_001371d9;
  case 2:
  case 4:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xf:
  case 0x10:
    goto switchD_00136d9f_caseD_2;
  case 3:
    inMechanism = RSA;
    local_50 = (undefined8 *)0x0;
    local_58 = 0;
    bVar4 = false;
    goto LAB_001371f0;
  case 5:
    bVar4 = true;
    inMechanism = RSA_MD5_PKCS;
    goto LAB_001371d9;
  case 6:
    bVar4 = true;
    inMechanism = RSA_SHA1_PKCS;
    goto LAB_001371d9;
  case 0xd:
    plVar3 = (long *)pMechanism->pParameter;
    if ((plVar3 == (long *)0x0) || (pMechanism->ulParameterLen != 0x18)) {
      iVar5 = 0x142e;
LAB_001373e0:
      softHSMLog(3,"AsymVerifyInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,iVar5,"Invalid parameters");
      return 7;
    }
    lVar2 = *plVar3;
    if (lVar2 == 0x270) {
      local_48._0_4_ = 6;
      local_60 = 4;
      uVar11 = 5;
    }
    else if (lVar2 == 0x250) {
      local_48._0_4_ = 4;
      local_60 = 2;
      uVar11 = 3;
    }
    else if (lVar2 == 0x255) {
      local_48._0_4_ = 3;
      local_60 = 5;
      uVar11 = 2;
    }
    else if (lVar2 == 0x260) {
      local_48._0_4_ = 5;
      local_60 = 3;
      uVar11 = 4;
    }
    else {
      if (lVar2 != 0x220) {
        return 7;
      }
      local_48._0_4_ = 2;
    }
    local_48 = CONCAT44(uVar11,(undefined4)local_48);
    if (plVar3[1] != local_60) {
      return 7;
    }
    local_40 = plVar3[2];
    local_50 = &local_48;
    local_58 = 0x10;
    inMechanism = RSA_PKCS_PSS;
    bVar4 = false;
    goto LAB_001371f0;
  case 0xe:
    plVar3 = (long *)pMechanism->pParameter;
    if (((plVar3 == (long *)0x0) || (pMechanism->ulParameterLen != 0x18)) ||
       ((*plVar3 != 0x220 || (plVar3[1] != 1)))) {
      iVar5 = 0x1463;
      goto LAB_001373e0;
    }
    local_48 = 0x100000002;
    local_40 = plVar3[2];
    inMechanism = RSA_SHA1_PKCS_PSS;
    goto LAB_001371cd;
  case 0x11:
    inMechanism = DSA;
    bVar4 = false;
    break;
  case 0x12:
    inMechanism = DSA_SHA1;
    bVar4 = true;
    break;
  case 0x13:
    inMechanism = DSA_SHA224;
    bVar4 = true;
    break;
  case 0x14:
    inMechanism = DSA_SHA256;
    bVar4 = true;
    break;
  case 0x15:
    inMechanism = DSA_SHA384;
    bVar4 = true;
    break;
  case 0x16:
    inMechanism = DSA_SHA512;
    bVar4 = true;
    break;
  default:
    switch(CVar1) {
    case 0x40:
      bVar4 = true;
      inMechanism = RSA_SHA256_PKCS;
      break;
    case 0x41:
      bVar4 = true;
      inMechanism = RSA_SHA384_PKCS;
      break;
    case 0x42:
      bVar4 = true;
      inMechanism = RSA_SHA512_PKCS;
      break;
    case 0x43:
      plVar3 = (long *)pMechanism->pParameter;
      if ((((plVar3 == (long *)0x0) || (pMechanism->ulParameterLen != 0x18)) || (*plVar3 != 0x250))
         || (plVar3[1] != 2)) {
        iVar5 = 0x1487;
        goto LAB_001373e0;
      }
      local_48 = 0x300000004;
      local_40 = plVar3[2];
      inMechanism = RSA_SHA256_PKCS_PSS;
      goto LAB_001371cd;
    case 0x44:
      plVar3 = (long *)pMechanism->pParameter;
      if (((plVar3 == (long *)0x0) || (pMechanism->ulParameterLen != 0x18)) ||
         ((*plVar3 != 0x260 || (plVar3[1] != 3)))) {
        iVar5 = 0x1499;
        goto LAB_001373e0;
      }
      local_48 = 0x400000005;
      local_40 = plVar3[2];
      inMechanism = RSA_SHA384_PKCS_PSS;
      goto LAB_001371cd;
    case 0x45:
      plVar3 = (long *)pMechanism->pParameter;
      if (((plVar3 == (long *)0x0) || (pMechanism->ulParameterLen != 0x18)) ||
         ((*plVar3 != 0x270 || (plVar3[1] != 4)))) {
        iVar5 = 0x14ab;
        goto LAB_001373e0;
      }
      local_48 = 0x500000006;
      local_40 = plVar3[2];
      inMechanism = RSA_SHA512_PKCS_PSS;
      goto LAB_001371cd;
    case 0x46:
      bVar4 = true;
      inMechanism = RSA_SHA224_PKCS;
      break;
    case 0x47:
      plVar3 = (long *)pMechanism->pParameter;
      if ((((plVar3 == (long *)0x0) || (pMechanism->ulParameterLen != 0x18)) || (*plVar3 != 0x255))
         || (plVar3[1] != 5)) {
        iVar5 = 0x1475;
        goto LAB_001373e0;
      }
      local_48 = 0x200000003;
      local_40 = plVar3[2];
      inMechanism = RSA_SHA224_PKCS_PSS;
LAB_001371cd:
      local_50 = &local_48;
      local_58 = 0x10;
      bVar4 = true;
      goto LAB_001371f0;
    default:
      if (CVar1 == 0x1041) {
        pCVar9 = CryptoFactory::i();
        iVar5 = (*pCVar9->_vptr_CryptoFactory[2])(pCVar9,5);
        inAsymmetricCryptoOp = (SoftHSM *)CONCAT44(extraout_var_03,iVar5);
        if (inAsymmetricCryptoOp == (SoftHSM *)0x0) {
          return 0x70;
        }
        pSVar10 = inAsymmetricCryptoOp;
        iVar5 = (*inAsymmetricCryptoOp->_vptr_SoftHSM[0x15])();
        publicKey = (DSAPublicKey *)CONCAT44(extraout_var_04,iVar5);
        if (publicKey == (DSAPublicKey *)0x0) goto LAB_0013725e;
        CVar8 = getECPublicKey(pSVar10,(ECPublicKey *)publicKey,local_38,key);
        if (CVar8 != 0) goto LAB_00137236;
        inMechanism = ECDSA;
LAB_00137024:
        local_50 = (undefined8 *)0x0;
        local_58 = 0;
        goto LAB_001372c5;
      }
      if (CVar1 != 0x1057) {
        return 0x70;
      }
      pCVar9 = CryptoFactory::i();
      iVar5 = (*pCVar9->_vptr_CryptoFactory[2])(pCVar9,7);
      inAsymmetricCryptoOp = (SoftHSM *)CONCAT44(extraout_var,iVar5);
      if (inAsymmetricCryptoOp == (SoftHSM *)0x0) {
        return 0x70;
      }
      pSVar10 = inAsymmetricCryptoOp;
      iVar5 = (*inAsymmetricCryptoOp->_vptr_SoftHSM[0x15])();
      publicKey = (DSAPublicKey *)CONCAT44(extraout_var_00,iVar5);
      if (publicKey == (DSAPublicKey *)0x0) goto LAB_0013725e;
      CVar8 = getEDPublicKey(pSVar10,(EDPublicKey *)publicKey,local_38,key);
      if (CVar8 == 0) {
        inMechanism = EDDSA;
        goto LAB_00137024;
      }
      goto LAB_00137236;
    }
LAB_001371d9:
    local_50 = (undefined8 *)0x0;
    local_58 = 0;
LAB_001371f0:
    pCVar9 = CryptoFactory::i();
    iVar5 = (*pCVar9->_vptr_CryptoFactory[2])(pCVar9,1);
    inAsymmetricCryptoOp = (SoftHSM *)CONCAT44(extraout_var_05,iVar5);
    if (inAsymmetricCryptoOp == (SoftHSM *)0x0) {
      return 0x70;
    }
    pSVar10 = inAsymmetricCryptoOp;
    iVar5 = (*inAsymmetricCryptoOp->_vptr_SoftHSM[0x15])();
    publicKey = (DSAPublicKey *)CONCAT44(extraout_var_06,iVar5);
    if (publicKey == (DSAPublicKey *)0x0) goto LAB_0013725e;
    CVar8 = getRSAPublicKey(pSVar10,(RSAPublicKey *)publicKey,local_38,key);
    if (CVar8 == 0) goto LAB_00137276;
    goto LAB_00137236;
  }
  pCVar9 = CryptoFactory::i();
  iVar5 = (*pCVar9->_vptr_CryptoFactory[2])(pCVar9,2);
  inAsymmetricCryptoOp = (SoftHSM *)CONCAT44(extraout_var_01,iVar5);
  if (inAsymmetricCryptoOp != (SoftHSM *)0x0) {
    pSVar10 = inAsymmetricCryptoOp;
    iVar5 = (*inAsymmetricCryptoOp->_vptr_SoftHSM[0x15])();
    publicKey = (DSAPublicKey *)CONCAT44(extraout_var_02,iVar5);
    if (publicKey == (DSAPublicKey *)0x0) {
LAB_0013725e:
      pCVar9 = CryptoFactory::i();
      (*pCVar9->_vptr_CryptoFactory[3])(pCVar9,inAsymmetricCryptoOp);
      CStack_70 = 2;
    }
    else {
      CVar8 = getDSAPublicKey(pSVar10,publicKey,local_38,key);
      if (CVar8 == 0) {
        local_58 = 0;
        local_50 = (undefined8 *)0x0;
LAB_00137276:
        if (bVar4) {
          iVar5 = (*inAsymmetricCryptoOp->_vptr_SoftHSM[7])
                            (inAsymmetricCryptoOp,publicKey,(ulong)inMechanism,local_50,local_58);
          bVar4 = true;
          if ((char)iVar5 == '\0') {
            (*inAsymmetricCryptoOp->_vptr_SoftHSM[0x1a])(inAsymmetricCryptoOp,publicKey);
            pCVar9 = CryptoFactory::i();
            (*pCVar9->_vptr_CryptoFactory[3])(pCVar9,inAsymmetricCryptoOp);
            return 0x70;
          }
        }
        else {
LAB_001372c5:
          bVar4 = false;
        }
        Session::setOpType(this_00,6);
        Session::setAsymmetricCryptoOp(this_00,(AsymmetricAlgorithm *)inAsymmetricCryptoOp);
        Session::setMechanism(this_00,inMechanism);
        Session::setParameters(this_00,local_50,local_58);
        Session::setAllowMultiPartOp(this_00,bVar4);
        Session::setAllowSinglePartOp(this_00,true);
        Session::setPublicKey(this_00,&publicKey->super_PublicKey);
        CStack_70 = 0;
      }
      else {
LAB_00137236:
        (*inAsymmetricCryptoOp->_vptr_SoftHSM[0x1a])(inAsymmetricCryptoOp,publicKey);
        pCVar9 = CryptoFactory::i();
        (*pCVar9->_vptr_CryptoFactory[3])(pCVar9,inAsymmetricCryptoOp);
LAB_00137257:
        CStack_70 = 5;
      }
    }
  }
switchD_00136d9f_caseD_2:
  return CStack_70;
}

Assistant:

CK_RV SoftHSM::AsymVerifyInit(CK_SESSION_HANDLE hSession, CK_MECHANISM_PTR pMechanism, CK_OBJECT_HANDLE hKey)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pMechanism == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check if we have another operation
	if (session->getOpType() != SESSION_OP_NONE) return CKR_OPERATION_ACTIVE;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL) return CKR_GENERAL_ERROR;

	// Check the key handle.
	OSObject *key = (OSObject *)handleManager->getObject(hKey);
	if (key == NULL_PTR || !key->isValid()) return CKR_OBJECT_HANDLE_INVALID;

	CK_BBOOL isOnToken = key->getBooleanValue(CKA_TOKEN, false);
	CK_BBOOL isPrivate = key->getBooleanValue(CKA_PRIVATE, true);

	// Check read user credentials
	CK_RV rv = haveRead(session->getState(), isOnToken, isPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");

		return rv;
	}

	// Check if key can be used for verifying
	if (!key->getBooleanValue(CKA_VERIFY, false))
		return CKR_KEY_FUNCTION_NOT_PERMITTED;

	// Check if the specified mechanism is allowed for the key
	if (!isMechanismPermitted(key, pMechanism))
		return CKR_MECHANISM_INVALID;

	// Get the asymmetric algorithm matching the mechanism
	AsymMech::Type mechanism = AsymMech::Unknown;
	void* param = NULL;
	size_t paramLen = 0;
	RSA_PKCS_PSS_PARAMS pssParam;
	bool bAllowMultiPartOp;
	bool isRSA = false;
	bool isDSA = false;
#ifdef WITH_ECC
	bool isECDSA = false;
#endif
#ifdef WITH_EDDSA
	bool isEDDSA = false;
#endif
	switch(pMechanism->mechanism) {
		case CKM_RSA_PKCS:
			mechanism = AsymMech::RSA_PKCS;
			bAllowMultiPartOp = false;
			isRSA = true;
			break;
		case CKM_RSA_X_509:
			mechanism = AsymMech::RSA;
			bAllowMultiPartOp = false;
			isRSA = true;
			break;
#ifndef WITH_FIPS
		case CKM_MD5_RSA_PKCS:
			mechanism = AsymMech::RSA_MD5_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
#endif
		case CKM_SHA1_RSA_PKCS:
			mechanism = AsymMech::RSA_SHA1_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA224_RSA_PKCS:
			mechanism = AsymMech::RSA_SHA224_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA256_RSA_PKCS:
			mechanism = AsymMech::RSA_SHA256_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA384_RSA_PKCS:
			mechanism = AsymMech::RSA_SHA384_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA512_RSA_PKCS:
			mechanism = AsymMech::RSA_SHA512_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
#ifdef WITH_RAW_PSS
		case CKM_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS))
			{
				ERROR_MSG("Invalid parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_PKCS_PSS;

			unsigned long expectedMgf;
			switch(CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg) {
				case CKM_SHA_1:
					pssParam.hashAlg = HashAlgo::SHA1;
					pssParam.mgf = AsymRSAMGF::MGF1_SHA1;
					expectedMgf = CKG_MGF1_SHA1;
					break;
				case CKM_SHA224:
					pssParam.hashAlg = HashAlgo::SHA224;
					pssParam.mgf = AsymRSAMGF::MGF1_SHA224;
					expectedMgf = CKG_MGF1_SHA224;
					break;
				case CKM_SHA256:
					pssParam.hashAlg = HashAlgo::SHA256;
					pssParam.mgf = AsymRSAMGF::MGF1_SHA256;
					expectedMgf = CKG_MGF1_SHA256;
					break;
				case CKM_SHA384:
					pssParam.hashAlg = HashAlgo::SHA384;
					pssParam.mgf = AsymRSAMGF::MGF1_SHA384;
					expectedMgf = CKG_MGF1_SHA384;
					break;
				case CKM_SHA512:
					pssParam.hashAlg = HashAlgo::SHA512;
					pssParam.mgf = AsymRSAMGF::MGF1_SHA512;
					expectedMgf = CKG_MGF1_SHA512;
					break;
				default:
					return CKR_ARGUMENTS_BAD;
			}

			if (CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != expectedMgf) {
				return CKR_ARGUMENTS_BAD;
			}

			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = false;
			isRSA = true;
			break;
#endif
		case CKM_SHA1_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS) ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg != CKM_SHA_1 ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != CKG_MGF1_SHA1)
			{
				ERROR_MSG("Invalid parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_SHA1_PKCS_PSS;
			pssParam.hashAlg = HashAlgo::SHA1;
			pssParam.mgf = AsymRSAMGF::MGF1_SHA1;
			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA224_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS) ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg != CKM_SHA224 ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != CKG_MGF1_SHA224)
			{
				ERROR_MSG("Invalid parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_SHA224_PKCS_PSS;
			pssParam.hashAlg = HashAlgo::SHA224;
			pssParam.mgf = AsymRSAMGF::MGF1_SHA224;
			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA256_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS) ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg != CKM_SHA256 ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != CKG_MGF1_SHA256)
			{
				ERROR_MSG("Invalid parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_SHA256_PKCS_PSS;
			pssParam.hashAlg = HashAlgo::SHA256;
			pssParam.mgf = AsymRSAMGF::MGF1_SHA256;
			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA384_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS) ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg != CKM_SHA384 ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != CKG_MGF1_SHA384)
			{
				ERROR_MSG("Invalid parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_SHA384_PKCS_PSS;
			pssParam.hashAlg = HashAlgo::SHA384;
			pssParam.mgf = AsymRSAMGF::MGF1_SHA384;
			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA512_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS) ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg != CKM_SHA512 ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != CKG_MGF1_SHA512)
			{
				ERROR_MSG("Invalid parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_SHA512_PKCS_PSS;
			pssParam.hashAlg = HashAlgo::SHA512;
			pssParam.mgf = AsymRSAMGF::MGF1_SHA512;
			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_DSA:
			mechanism = AsymMech::DSA;
			bAllowMultiPartOp = false;
			isDSA = true;
			break;
		case CKM_DSA_SHA1:
			mechanism = AsymMech::DSA_SHA1;
			bAllowMultiPartOp = true;
			isDSA = true;
			break;
		case CKM_DSA_SHA224:
			mechanism = AsymMech::DSA_SHA224;
			bAllowMultiPartOp = true;
			isDSA = true;
			break;
		case CKM_DSA_SHA256:
			mechanism = AsymMech::DSA_SHA256;
			bAllowMultiPartOp = true;
			isDSA = true;
			break;
		case CKM_DSA_SHA384:
			mechanism = AsymMech::DSA_SHA384;
			bAllowMultiPartOp = true;
			isDSA = true;
			break;
		case CKM_DSA_SHA512:
			mechanism = AsymMech::DSA_SHA512;
			bAllowMultiPartOp = true;
			isDSA = true;
			break;
#ifdef WITH_ECC
		case CKM_ECDSA:
			mechanism = AsymMech::ECDSA;
			bAllowMultiPartOp = false;
			isECDSA = true;
			break;
#endif
#ifdef WITH_GOST
		case CKM_GOSTR3410:
			mechanism = AsymMech::GOST;
			bAllowMultiPartOp = false;
			break;
		case CKM_GOSTR3410_WITH_GOSTR3411:
			mechanism = AsymMech::GOST_GOST;
			bAllowMultiPartOp = true;
			break;
#endif
#ifdef WITH_EDDSA
		case CKM_EDDSA:
			mechanism = AsymMech::EDDSA;
			bAllowMultiPartOp = false;
			isEDDSA = true;
			break;
#endif
		default:
			return CKR_MECHANISM_INVALID;
	}

	AsymmetricAlgorithm* asymCrypto = NULL;
	PublicKey* publicKey = NULL;
	if (isRSA)
	{
		asymCrypto = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::RSA);
		if (asymCrypto == NULL) return CKR_MECHANISM_INVALID;

		publicKey = asymCrypto->newPublicKey();
		if (publicKey == NULL)
		{
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_HOST_MEMORY;
		}

		if (getRSAPublicKey((RSAPublicKey*)publicKey, token, key) != CKR_OK)
		{
			asymCrypto->recyclePublicKey(publicKey);
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_GENERAL_ERROR;
		}
	}
	else if (isDSA)
	{
		asymCrypto = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::DSA);
		if (asymCrypto == NULL) return CKR_MECHANISM_INVALID;

		publicKey = asymCrypto->newPublicKey();
		if (publicKey == NULL)
		{
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_HOST_MEMORY;
		}

		if (getDSAPublicKey((DSAPublicKey*)publicKey, token, key) != CKR_OK)
		{
			asymCrypto->recyclePublicKey(publicKey);
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_GENERAL_ERROR;
		}
        }
#ifdef WITH_ECC
	else if (isECDSA)
	{
		asymCrypto = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::ECDSA);
		if (asymCrypto == NULL) return CKR_MECHANISM_INVALID;

		publicKey = asymCrypto->newPublicKey();
		if (publicKey == NULL)
		{
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_HOST_MEMORY;
		}

		if (getECPublicKey((ECPublicKey*)publicKey, token, key) != CKR_OK)
		{
			asymCrypto->recyclePublicKey(publicKey);
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_GENERAL_ERROR;
		}
	}
#endif
#ifdef WITH_EDDSA
	else if (isEDDSA)
	{
		asymCrypto = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::EDDSA);
		if (asymCrypto == NULL) return CKR_MECHANISM_INVALID;

		publicKey = asymCrypto->newPublicKey();
		if (publicKey == NULL)
		{
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_HOST_MEMORY;
		}

		if (getEDPublicKey((EDPublicKey*)publicKey, token, key) != CKR_OK)
		{
			asymCrypto->recyclePublicKey(publicKey);
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_GENERAL_ERROR;
		}
	}
#endif
	else
	{
#ifdef WITH_GOST
		asymCrypto = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::GOST);
		if (asymCrypto == NULL) return CKR_MECHANISM_INVALID;

		publicKey = asymCrypto->newPublicKey();
		if (publicKey == NULL)
		{
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_HOST_MEMORY;
		}

		if (getGOSTPublicKey((GOSTPublicKey*)publicKey, token, key) != CKR_OK)
		{
			asymCrypto->recyclePublicKey(publicKey);
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_GENERAL_ERROR;
		}
#else
		return CKR_MECHANISM_INVALID;
#endif
        }